

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::block(SocketMonitor *this,Strategy *strategy,bool should_poll,double timeout)

{
  _func_int *p_Var1;
  long lVar2;
  nfds_t __nfds;
  SocketMonitor *pSVar3;
  uint pfds_size_00;
  double timeout_00;
  Strategy *pSVar4;
  bool bVar5;
  int __timeout;
  size_type sVar6;
  uint *puVar7;
  size_type sVar8;
  pollfd *ppVar9;
  Sockets *pSVar10;
  pollfd apStack_a0 [2];
  nfds_t local_90;
  size_type local_88;
  int local_7c;
  Sockets *local_78;
  pollfd *local_70;
  pollfd *local_68;
  Sockets *local_60;
  Strategy *local_58;
  SocketMonitor *local_50;
  int local_48;
  int result;
  unsigned_long __vla_expr0;
  uint local_2c;
  double dStack_28;
  int pfds_size;
  double timeout_local;
  Strategy *pSStack_18;
  bool should_poll_local;
  Strategy *strategy_local;
  SocketMonitor *this_local;
  
  local_50 = this;
  dStack_28 = timeout;
  timeout_local._7_1_ = should_poll;
  pSStack_18 = strategy;
  strategy_local = (Strategy *)this;
  while( true ) {
    apStack_a0[0].fd = 0x2d4547;
    apStack_a0[0].events = 0;
    apStack_a0[0].revents = 0;
    sVar6 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::size(&local_50->m_dropped);
    if (sVar6 == 0) break;
    local_58 = pSStack_18;
    apStack_a0[0].fd = 0x2d4565;
    apStack_a0[0].events = 0;
    apStack_a0[0].revents = 0;
    puVar7 = (uint *)std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                               (&local_50->m_dropped);
    apStack_a0[0].fd = 0x2d4575;
    apStack_a0[0].events = 0;
    apStack_a0[0].revents = 0;
    (*local_58->_vptr_Strategy[5])(local_58,local_50,(ulong)*puVar7);
    apStack_a0[0].fd = 0x2d4585;
    apStack_a0[0].events = 0;
    apStack_a0[0].revents = 0;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&local_50->m_dropped);
    apStack_a0[0].fd = 0x2d4595;
    apStack_a0[0].events = 0;
    apStack_a0[0].revents = 0;
    sVar6 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::size(&local_50->m_dropped);
    if (sVar6 == 0) {
      return;
    }
  }
  apStack_a0[0].fd = 0x2d45af;
  apStack_a0[0].events = 0;
  apStack_a0[0].revents = 0;
  local_88 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&local_50->m_readSockets);
  apStack_a0[0].fd = 0x2d45c0;
  apStack_a0[0].events = 0;
  apStack_a0[0].revents = 0;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&local_50->m_connectSockets);
  local_7c = (int)local_88 + (int)sVar8;
  apStack_a0[0].fd = 0x2d45d9;
  apStack_a0[0].events = 0;
  apStack_a0[0].revents = 0;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&local_50->m_writeSockets);
  pSVar3 = local_50;
  local_2c = local_7c + (int)sVar8;
  _result = (ulong)local_2c;
  lVar2 = -(_result * 8 + 0xf & 0xfffffffffffffff0);
  ppVar9 = (pollfd *)((long)apStack_a0 + lVar2 + 8U);
  pSVar10 = &local_50->m_readSockets;
  local_70 = ppVar9;
  __vla_expr0 = (unsigned_long)(apStack_a0 + 1);
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4620;
  buildSet(pSVar3,pSVar10,ppVar9,3);
  local_78 = &local_50->m_connectSockets;
  pSVar10 = &local_50->m_readSockets;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4638;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(pSVar10);
  pSVar3 = local_50;
  pSVar10 = local_78;
  ppVar9 = local_70 + sVar8;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4655;
  buildSet(pSVar3,pSVar10,ppVar9,0xc);
  local_60 = &local_50->m_writeSockets;
  pSVar10 = &local_50->m_readSockets;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d466f;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(pSVar10);
  local_68 = local_70 + sVar8;
  pSVar10 = &local_50->m_connectSockets;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d468e;
  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(pSVar10);
  pSVar3 = local_50;
  pSVar10 = local_60;
  ppVar9 = local_68 + sVar8;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d46ab;
  buildSet(pSVar3,pSVar10,ppVar9,4);
  pSVar3 = local_50;
  bVar5 = (bool)(timeout_local._7_1_ & 1);
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d46bc;
  bVar5 = sleepIfEmpty(pSVar3,bVar5);
  pSVar4 = pSStack_18;
  timeout_00 = dStack_28;
  pSVar3 = local_50;
  if (bVar5) {
    p_Var1 = pSStack_18->_vptr_Strategy[7];
    *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d46d0;
    (*p_Var1)(pSVar4,pSVar3);
    return;
  }
  local_90 = (nfds_t)(int)local_2c;
  bVar5 = (bool)(timeout_local._7_1_ & 1);
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d46fd;
  __timeout = getTimeval(pSVar3,bVar5,timeout_00);
  ppVar9 = local_70;
  __nfds = local_90;
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d470f;
  local_48 = poll((pollfd *)ppVar9,__nfds,__timeout);
  pSVar4 = pSStack_18;
  pfds_size_00 = local_2c;
  pSVar3 = local_50;
  ppVar9 = local_70;
  if (local_48 == 0) {
    p_Var1 = pSStack_18->_vptr_Strategy[7];
    *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4726;
    (*p_Var1)(pSVar4,pSVar3);
    return;
  }
  if (0 < local_48) {
    *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4749;
    processPollList(pSVar3,pSVar4,ppVar9,pfds_size_00);
    return;
  }
  p_Var1 = pSStack_18->_vptr_Strategy[6];
  *(undefined8 *)((long)apStack_a0 + lVar2) = 0x2d4759;
  (*p_Var1)(pSVar4,pSVar3);
  return;
}

Assistant:

void SocketMonitor::block(Strategy &strategy, bool should_poll, double timeout) {
  while (m_dropped.size()) {
    strategy.onError(*this, m_dropped.front());
    m_dropped.pop();
    if (m_dropped.size() == 0) {
      return;
    }
  }

  int pfds_size = m_readSockets.size() + m_connectSockets.size() + m_writeSockets.size();
  struct pollfd pfds[pfds_size];
  buildSet(m_readSockets, pfds, POLLPRI | POLLIN);
  buildSet(m_connectSockets, pfds + m_readSockets.size(), POLLOUT | POLLERR);
  buildSet(m_writeSockets, pfds + m_readSockets.size() + m_connectSockets.size(), POLLOUT);

  if (sleepIfEmpty(should_poll)) {
    strategy.onTimeout(*this);
    return;
  }

  int result = poll(pfds, pfds_size, getTimeval(should_poll, timeout));

  if (result == 0) {
    strategy.onTimeout(*this);
    return;
  } else if (result > 0) {
    processPollList(strategy, pfds, pfds_size);
  } else {
    strategy.onError(*this);
  }
}